

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O2

int Sfm_NtkWindowToSolver(Sfm_Ntk_t *p)

{
  uint uVar1;
  Vec_Wec_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *vCnf;
  abctime aVar9;
  int i;
  int iVar10;
  lit *plVar11;
  char *__assertion;
  int local_5c;
  int local_58;
  int local_54;
  sat_solver *local_50;
  int local_44;
  int local_40;
  int local_3c;
  abctime local_38;
  
  local_38 = Abc_Clock();
  sat_solver_restart(p->pSat);
  sat_solver_setnvars(p->pSat,p->vRoots->nSize + p->vOrder->nSize + p->vTfo->nSize + 0xb);
  for (iVar10 = 1; iVar10 < p->nSatVars; iVar10 = iVar10 + 1) {
    iVar3 = Vec_IntEntry(&p->vVar2Id,iVar10);
    if (iVar3 != -1) {
      Sfm_ObjCleanSatVar(p,iVar10);
    }
  }
  p->nSatVars = 1;
  for (iVar10 = 0; iVar10 < p->vOrder->nSize; iVar10 = iVar10 + 1) {
    iVar4 = Vec_IntEntry(p->vOrder,iVar10);
    iVar3 = p->nSatVars;
    p->nSatVars = iVar3 + 1;
    Sfm_ObjSetSatVar(p,iVar4,iVar3);
  }
  p->vDivVars->nSize = 0;
  for (iVar10 = 0; iVar10 < p->vDivs->nSize; iVar10 = iVar10 + 1) {
    iVar3 = Vec_IntEntry(p->vDivs,iVar10);
    pVVar8 = p->vDivVars;
    iVar3 = Sfm_ObjSatVar(p,iVar3);
    Vec_IntPush(pVVar8,iVar3);
  }
  for (iVar10 = 0; iVar10 < p->vOrder->nSize; iVar10 = iVar10 + 1) {
    iVar3 = Vec_IntEntry(p->vOrder,iVar10);
    if (p->nPis <= iVar3) {
      p->vFaninMap->nSize = 0;
      for (iVar4 = 0; iVar5 = Sfm_ObjFaninNum(p,iVar3), iVar4 < iVar5; iVar4 = iVar4 + 1) {
        iVar5 = Sfm_ObjFanin(p,iVar3,iVar4);
        pVVar8 = p->vFaninMap;
        iVar5 = Sfm_ObjSatVar(p,iVar5);
        Vec_IntPush(pVVar8,iVar5);
      }
      pVVar8 = p->vFaninMap;
      iVar4 = Sfm_ObjSatVar(p,iVar3);
      Vec_IntPush(pVVar8,iVar4);
      pVVar2 = p->vClauses;
      pVVar8 = Vec_WecEntry(p->vCnfs,iVar3);
      Sfm_TranslateCnf(pVVar2,(Vec_Str_t *)pVVar8,p->vFaninMap,-1);
      iVar3 = 0;
      while (iVar3 < p->vClauses->nSize) {
        pVVar8 = Vec_WecEntry(p->vClauses,iVar3);
        if ((long)pVVar8->nSize == 0) break;
        iVar4 = sat_solver_addclause(p->pSat,pVVar8->pArray,pVVar8->pArray + pVVar8->nSize);
        iVar3 = iVar3 + 1;
        if (iVar4 == 0) {
          return 0;
        }
      }
    }
  }
  if (0 < p->vTfo->nSize) {
    if (p->pPars->nTfoLevMax < 1) {
      __assertion = "p->pPars->nTfoLevMax > 0";
      uVar1 = 100;
    }
    else if (p->vRoots->nSize < 1) {
      __assertion = "Vec_IntSize(p->vRoots) > 0";
      uVar1 = 0x65;
    }
    else {
      iVar3 = 0;
      iVar10 = Vec_IntEntry(p->vTfo,0);
      if (iVar10 != p->iPivotNode) {
        p->vLits->nSize = 0;
        for (; iVar3 < p->vRoots->nSize; iVar3 = iVar3 + 1) {
          iVar10 = Vec_IntEntry(p->vRoots,iVar3);
          pVVar8 = p->vLits;
          iVar10 = Sfm_ObjSatVar(p,iVar10);
          Vec_IntPush(pVVar8,iVar10);
        }
        iVar10 = 0;
        while( true ) {
          pVVar8 = p->vTfo;
          iVar3 = pVVar8->nSize;
          if (iVar3 <= iVar10) break;
          iVar4 = Vec_IntEntry(pVVar8,iVar10);
          iVar3 = Sfm_ObjSatVar(p,iVar4);
          Sfm_ObjCleanSatVar(p,iVar3);
          iVar3 = p->nSatVars;
          p->nSatVars = iVar3 + 1;
          Sfm_ObjSetSatVar(p,iVar4,iVar3);
          iVar10 = iVar10 + 1;
        }
        for (iVar10 = 0; iVar10 < iVar3; iVar10 = iVar10 + 1) {
          iVar3 = Vec_IntEntry(pVVar8,iVar10);
          if ((iVar3 < p->nPis) || (p->nObjs <= p->nPos + iVar3)) {
            __assertion = "Sfm_ObjIsNode(p, iNode)";
            uVar1 = 0x74;
            goto LAB_00452ab5;
          }
          p->vFaninMap->nSize = 0;
          for (iVar4 = 0; iVar5 = Sfm_ObjFaninNum(p,iVar3), iVar4 < iVar5; iVar4 = iVar4 + 1) {
            iVar5 = Sfm_ObjFanin(p,iVar3,iVar4);
            pVVar8 = p->vFaninMap;
            iVar5 = Sfm_ObjSatVar(p,iVar5);
            Vec_IntPush(pVVar8,iVar5);
          }
          pVVar8 = p->vFaninMap;
          iVar4 = Sfm_ObjSatVar(p,iVar3);
          Vec_IntPush(pVVar8,iVar4);
          pVVar2 = p->vClauses;
          vCnf = Vec_WecEntry(p->vCnfs,iVar3);
          pVVar8 = p->vFaninMap;
          iVar3 = Sfm_ObjSatVar(p,p->iPivotNode);
          Sfm_TranslateCnf(pVVar2,(Vec_Str_t *)vCnf,pVVar8,iVar3);
          iVar3 = 0;
          while (iVar3 < p->vClauses->nSize) {
            pVVar8 = Vec_WecEntry(p->vClauses,iVar3);
            if ((long)pVVar8->nSize == 0) break;
            iVar4 = sat_solver_addclause(p->pSat,pVVar8->pArray,pVVar8->pArray + pVVar8->nSize);
            iVar3 = iVar3 + 1;
            if (iVar4 == 0) {
              return 0;
            }
          }
          pVVar8 = p->vTfo;
          iVar3 = pVVar8->nSize;
        }
        for (iVar10 = 0; iVar10 < p->vRoots->nSize; iVar10 = iVar10 + 1) {
          iVar3 = Vec_IntEntry(p->vRoots,iVar10);
          local_50 = p->pSat;
          local_40 = iVar10;
          uVar6 = Vec_IntEntry(p->vLits,iVar10);
          uVar7 = Sfm_ObjSatVar(p,iVar3);
          uVar1 = p->nSatVars;
          p->nSatVars = uVar1 + 1;
          if ((int)(uVar7 | uVar6 | uVar1) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
          }
          iVar10 = uVar6 * 2 + 1;
          local_58 = uVar7 * 2 + 1;
          local_54 = uVar1 * 2 + 1;
          local_5c = iVar10;
          local_44 = local_54;
          local_3c = local_58;
          iVar3 = sat_solver_addclause(local_50,&local_5c,(lit *)&local_50);
          if (iVar3 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
          }
          local_5c = iVar10;
          local_58 = uVar7 * 2;
          local_54 = uVar1 * 2;
          iVar10 = sat_solver_addclause(local_50,&local_5c,(lit *)&local_50);
          if (iVar10 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
          }
          local_58 = local_3c;
          local_5c = uVar6 * 2;
          local_54 = uVar1 * 2;
          iVar10 = sat_solver_addclause(local_50,&local_5c,(lit *)&local_50);
          if (iVar10 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
          }
          local_54 = local_44;
          plVar11 = &local_5c;
          local_5c = uVar6 * 2;
          local_58 = uVar7 * 2;
          iVar10 = sat_solver_addclause(local_50,&local_5c,(lit *)&local_50);
          if (iVar10 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
          }
          pVVar8 = p->vLits;
          iVar3 = Abc_Var2Lit(p->nSatVars + -1,(int)plVar11);
          iVar10 = local_40;
          Vec_IntWriteEntry(pVVar8,local_40,iVar3);
        }
        plVar11 = p->vLits->pArray;
        iVar10 = sat_solver_addclause(p->pSat,plVar11,plVar11 + p->vLits->nSize);
        if (iVar10 == 0) {
          return 0;
        }
        goto LAB_00452a7a;
      }
      __assertion = "Vec_IntEntry(p->vTfo, 0) != p->iPivotNode";
      uVar1 = 0x66;
    }
LAB_00452ab5:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                  ,uVar1,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
  }
LAB_00452a7a:
  iVar10 = sat_solver_simplify(p->pSat);
  aVar9 = Abc_Clock();
  p->timeCnf = p->timeCnf + (aVar9 - local_38);
  return iVar10;
}

Assistant:

int Sfm_NtkWindowToSolver( Sfm_Ntk_t * p )
{
    // p->vOrder contains all variables in the window in a good order
    // p->vDivs is a subset of nodes in p->vOrder used as divisor candidates
    // p->vTfo contains TFO of the node (does not include node)
    // p->vRoots contains roots of the TFO of the node (may include node)
    Vec_Int_t * vClause;
    int RetValue, iNode = -1, iFanin, i, k;
    abctime clk = Abc_Clock();
//    if ( p->pSat )
//        printf( "%d  ", p->pSat->stats.learnts );
    sat_solver_restart( p->pSat );
    sat_solver_setnvars( p->pSat, 1 + Vec_IntSize(p->vOrder) + Vec_IntSize(p->vTfo) + Vec_IntSize(p->vRoots) + 10 );
    // create SAT variables
    Sfm_NtkCleanVars( p );
    p->nSatVars = 1;
    Vec_IntForEachEntry( p->vOrder, iNode, i )
        Sfm_ObjSetSatVar( p, iNode, p->nSatVars++ );
    // collect divisor variables
    Vec_IntClear( p->vDivVars );
    Vec_IntForEachEntry( p->vDivs, iNode, i )
        Vec_IntPush( p->vDivVars, Sfm_ObjSatVar(p, iNode) );
    // add CNF clauses for the TFI
    Vec_IntForEachEntry( p->vOrder, iNode, i )
    {
        if ( Sfm_ObjIsPi(p, iNode) )
            continue;
        // collect fanin variables
        Vec_IntClear( p->vFaninMap );
        Sfm_ObjForEachFanin( p, iNode, iFanin, k )
            Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iFanin) );
        Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iNode) );
        // generate CNF 
        Sfm_TranslateCnf( p->vClauses, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode), p->vFaninMap, -1 );
        // add clauses
        Vec_WecForEachLevel( p->vClauses, vClause, k )
        {
            if ( Vec_IntSize(vClause) == 0 )
                break;
            RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
            if ( RetValue == 0 )
                return 0;
        }
    }
    if ( Vec_IntSize(p->vTfo) > 0 )
    {
        assert( p->pPars->nTfoLevMax > 0 );
        assert( Vec_IntSize(p->vRoots) > 0 );
        assert( Vec_IntEntry(p->vTfo, 0) != p->iPivotNode );
        // collect variables of root nodes
        Vec_IntClear( p->vLits );
        Vec_IntForEachEntry( p->vRoots, iNode, i )
            Vec_IntPush( p->vLits, Sfm_ObjSatVar(p, iNode) );
        // assign new variables to the TFO nodes
        Vec_IntForEachEntry( p->vTfo, iNode, i )
        {
            Sfm_ObjCleanSatVar( p, Sfm_ObjSatVar(p, iNode) );
            Sfm_ObjSetSatVar( p, iNode, p->nSatVars++ );
        }
        // add CNF clauses for the TFO
        Vec_IntForEachEntry( p->vTfo, iNode, i )
        {
            assert( Sfm_ObjIsNode(p, iNode) );
            // collect fanin variables
            Vec_IntClear( p->vFaninMap );
            Sfm_ObjForEachFanin( p, iNode, iFanin, k )
                Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iFanin) );
            Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iNode) );
            // generate CNF 
            Sfm_TranslateCnf( p->vClauses, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode), p->vFaninMap, Sfm_ObjSatVar(p, p->iPivotNode) );
            // add clauses
            Vec_WecForEachLevel( p->vClauses, vClause, k )
            {
                if ( Vec_IntSize(vClause) == 0 )
                    break;
                RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
                if ( RetValue == 0 )
                    return 0;
            }
        }
        // create XOR clauses for the roots
        Vec_IntForEachEntry( p->vRoots, iNode, i )
        {
            sat_solver_add_xor( p->pSat, Vec_IntEntry(p->vLits, i), Sfm_ObjSatVar(p, iNode), p->nSatVars++, 0 );
            Vec_IntWriteEntry( p->vLits, i, Abc_Var2Lit(p->nSatVars-1, 0) );
        }
        // make OR clause for the last nRoots variables
        RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits) );
        if ( RetValue == 0 )
            return 0;
    }
    // finalize
    RetValue = sat_solver_simplify( p->pSat );
    p->timeCnf += Abc_Clock() - clk;
    return RetValue;
}